

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void ipc_on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  tcp_conn *loop;
  uv_loop_t *puVar4;
  void *pvVar5;
  undefined8 *extraout_RDX;
  uv_pipe_t *unaff_RBX;
  uv_pipe_t *loop_00;
  uv_loop_t *puVar6;
  uv_pipe_t *puVar7;
  char *pcVar8;
  uv_tcp_t *puVar9;
  uv_write_t *puVar10;
  ulong uVar11;
  uv_buf_t uStack_d8;
  uv_loop_t *puStack_c8;
  uv_buf_t uStack_c0;
  sockaddr_in sStack_b0;
  uv_loop_t *puStack_a0;
  sockaddr_in sStack_90;
  uv_loop_t *puStack_80;
  uv_buf_t uStack_48;
  uv_loop_t *puStack_38;
  sockaddr_in sStack_30;
  uv_buf_t local_10;
  
  if (connection_accepted != '\0') {
    return;
  }
  if (status == 0) {
    if (server != (uv_stream_t *)&tcp_server) goto LAB_001602e6;
    iVar1 = uv_tcp_init(tcp_server.loop,&conn.conn);
    if (iVar1 != 0) goto LAB_001602eb;
    iVar1 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)&conn.conn);
    if (iVar1 != 0) goto LAB_001602f0;
    uv_close((uv_handle_t *)&conn.conn,close_cb);
    local_10 = uv_buf_init("accepted_connection\n",0x14);
    iVar1 = uv_write2(&conn_notify_req,(uv_stream_t *)&channel,&local_10,1,(uv_stream_t *)0x0,
                      conn_notify_write_cb);
    if (iVar1 == 0) {
      connection_accepted = 1;
      return;
    }
  }
  else {
    ipc_on_connection_cold_1();
LAB_001602e6:
    ipc_on_connection_cold_2();
LAB_001602eb:
    ipc_on_connection_cold_3();
LAB_001602f0:
    ipc_on_connection_cold_4();
  }
  ipc_on_connection_cold_5();
  puStack_38 = (uv_loop_t *)0x160304;
  loop = (tcp_conn *)uv_default_loop();
  iVar1 = 0x2ff768;
  puStack_38 = (uv_loop_t *)0x160318;
  iVar2 = uv_pipe_init((uv_loop_t *)loop,&channel,1);
  if (iVar2 == 0) {
    unaff_RBX = &channel;
    iVar1 = 0;
    puStack_38 = (uv_loop_t *)0x160331;
    uv_pipe_open(&channel,0);
    puVar7 = &channel;
    puStack_38 = (uv_loop_t *)0x160339;
    iVar2 = uv_is_readable((uv_stream_t *)&channel);
    loop = (tcp_conn *)puVar7;
    if (iVar2 != 1) goto LAB_001604b8;
    puVar7 = &channel;
    puStack_38 = (uv_loop_t *)0x16034e;
    iVar2 = uv_is_writable((uv_stream_t *)&channel);
    loop = (tcp_conn *)puVar7;
    if (iVar2 != 1) goto LAB_001604bd;
    puVar7 = &channel;
    puStack_38 = (uv_loop_t *)0x160363;
    iVar2 = uv_is_closing((uv_handle_t *)&channel);
    loop = (tcp_conn *)puVar7;
    if (iVar2 != 0) goto LAB_001604c2;
    puStack_38 = (uv_loop_t *)0x160370;
    loop = (tcp_conn *)uv_default_loop();
    iVar1 = 0x2ff870;
    puStack_38 = (uv_loop_t *)0x16037f;
    iVar2 = uv_tcp_init((uv_loop_t *)loop,&tcp_server);
    if (iVar2 != 0) goto LAB_001604c7;
    pcVar8 = "0.0.0.0";
    iVar1 = 0x23a3;
    puStack_38 = (uv_loop_t *)0x16039b;
    iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_30);
    loop = (tcp_conn *)pcVar8;
    if (iVar2 != 0) goto LAB_001604cc;
    puVar9 = &tcp_server;
    puStack_38 = (uv_loop_t *)0x1603b4;
    iVar1 = (int)&sStack_30;
    iVar2 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_30,0);
    loop = (tcp_conn *)puVar9;
    if (iVar2 != 0) goto LAB_001604d1;
    puVar9 = &tcp_server;
    iVar1 = 0x80;
    puStack_38 = (uv_loop_t *)0x1603d4;
    iVar2 = uv_listen((uv_stream_t *)&tcp_server,0x80,ipc_on_connection_tcp_conn);
    loop = (tcp_conn *)puVar9;
    if (iVar2 != 0) goto LAB_001604d6;
    puStack_38 = (uv_loop_t *)0x1603e1;
    loop = (tcp_conn *)uv_default_loop();
    iVar1 = 0x2ffb50;
    puStack_38 = (uv_loop_t *)0x1603f0;
    iVar2 = uv_tcp_init((uv_loop_t *)loop,&conn.conn);
    if (iVar2 != 0) goto LAB_001604db;
    loop = (tcp_conn *)0x1a4b5a;
    iVar1 = 0x23a3;
    puStack_38 = (uv_loop_t *)0x16040c;
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_30);
    if (iVar2 != 0) goto LAB_001604e0;
    loop = &conn;
    iVar1 = 0x2ffb50;
    puStack_38 = (uv_loop_t *)0x160431;
    iVar2 = uv_tcp_connect(&conn.conn_req,&conn.conn,(sockaddr *)&sStack_30,connect_child_process_cb
                          );
    if (iVar2 != 0) goto LAB_001604e5;
    puStack_38 = (uv_loop_t *)0x16043e;
    loop = (tcp_conn *)uv_default_loop();
    iVar1 = 0;
    puStack_38 = (uv_loop_t *)0x160448;
    iVar2 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001604ea;
    if (tcp_conn_read_cb_called != 1) goto LAB_001604ef;
    if (tcp_conn_write_cb_called != 1) goto LAB_001604f4;
    if (close_cb_called != 4) goto LAB_001604f9;
    puStack_38 = (uv_loop_t *)0x16047c;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_38 = (uv_loop_t *)0x160490;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    iVar1 = 0;
    puStack_38 = (uv_loop_t *)0x16049a;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puStack_38 = (uv_loop_t *)0x16049f;
    loop = (tcp_conn *)uv_default_loop();
    puStack_38 = (uv_loop_t *)0x1604a7;
    iVar2 = uv_loop_close((uv_loop_t *)loop);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    puStack_38 = (uv_loop_t *)0x1604b8;
    ipc_helper_tcp_connection_cold_1();
LAB_001604b8:
    puStack_38 = (uv_loop_t *)0x1604bd;
    ipc_helper_tcp_connection_cold_2();
LAB_001604bd:
    puStack_38 = (uv_loop_t *)0x1604c2;
    ipc_helper_tcp_connection_cold_3();
LAB_001604c2:
    puStack_38 = (uv_loop_t *)0x1604c7;
    ipc_helper_tcp_connection_cold_4();
LAB_001604c7:
    puStack_38 = (uv_loop_t *)0x1604cc;
    ipc_helper_tcp_connection_cold_5();
LAB_001604cc:
    puStack_38 = (uv_loop_t *)0x1604d1;
    ipc_helper_tcp_connection_cold_6();
LAB_001604d1:
    puStack_38 = (uv_loop_t *)0x1604d6;
    ipc_helper_tcp_connection_cold_7();
LAB_001604d6:
    puStack_38 = (uv_loop_t *)0x1604db;
    ipc_helper_tcp_connection_cold_8();
LAB_001604db:
    puStack_38 = (uv_loop_t *)0x1604e0;
    ipc_helper_tcp_connection_cold_9();
LAB_001604e0:
    puStack_38 = (uv_loop_t *)0x1604e5;
    ipc_helper_tcp_connection_cold_10();
LAB_001604e5:
    puStack_38 = (uv_loop_t *)0x1604ea;
    ipc_helper_tcp_connection_cold_11();
LAB_001604ea:
    puStack_38 = (uv_loop_t *)0x1604ef;
    ipc_helper_tcp_connection_cold_12();
LAB_001604ef:
    puStack_38 = (uv_loop_t *)0x1604f4;
    ipc_helper_tcp_connection_cold_13();
LAB_001604f4:
    puStack_38 = (uv_loop_t *)0x1604f9;
    ipc_helper_tcp_connection_cold_14();
LAB_001604f9:
    puStack_38 = (uv_loop_t *)0x1604fe;
    ipc_helper_tcp_connection_cold_15();
  }
  puStack_38 = (uv_loop_t *)ipc_on_connection_tcp_conn;
  ipc_helper_tcp_connection_cold_16();
  puStack_38 = (uv_loop_t *)unaff_RBX;
  if (iVar1 == 0) {
    puVar10 = (uv_write_t *)loop;
    if (loop != (tcp_conn *)&tcp_server) goto LAB_001605d8;
    puVar10 = (uv_write_t *)0xf8;
    puVar4 = (uv_loop_t *)malloc(0xf8);
    if (puVar4 == (uv_loop_t *)0x0) goto LAB_001605dd;
    puVar6 = puVar4;
    puVar10 = (uv_write_t *)tcp_server.loop;
    iVar2 = uv_tcp_init(tcp_server.loop,(uv_tcp_t *)puVar4);
    iVar1 = (int)puVar6;
    if (iVar2 != 0) goto LAB_001605e2;
    puVar9 = &tcp_server;
    puVar6 = puVar4;
    iVar2 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)puVar4);
    iVar1 = (int)puVar6;
    puVar10 = (uv_write_t *)puVar9;
    if (iVar2 != 0) goto LAB_001605e7;
    uStack_48 = uv_buf_init("hello\n",6);
    puVar10 = &conn_notify_req;
    iVar1 = 0x2ff768;
    iVar2 = uv_write2(&conn_notify_req,(uv_stream_t *)&channel,&uStack_48,1,(uv_stream_t *)puVar4,
                      (uv_write_cb)0x0);
    if (iVar2 != 0) goto LAB_001605ec;
    iVar1 = 0x160d2c;
    puVar10 = (uv_write_t *)puVar4;
    iVar2 = uv_read_start((uv_stream_t *)puVar4,on_read_alloc,on_tcp_child_process_read);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)puVar4,close_cb);
      return;
    }
  }
  else {
    ipc_on_connection_tcp_conn_cold_1();
    puVar10 = (uv_write_t *)loop;
LAB_001605d8:
    ipc_on_connection_tcp_conn_cold_2();
LAB_001605dd:
    ipc_on_connection_tcp_conn_cold_7();
LAB_001605e2:
    ipc_on_connection_tcp_conn_cold_3();
LAB_001605e7:
    ipc_on_connection_tcp_conn_cold_4();
LAB_001605ec:
    ipc_on_connection_tcp_conn_cold_5();
  }
  ipc_on_connection_tcp_conn_cold_6();
  if (iVar1 == 0) {
    iVar1 = uv_read_start((uv_stream_t *)((uv_loop_t *)puVar10)->pending_queue[0],on_read_alloc,
                          on_tcp_child_process_read);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    connect_child_process_cb_cold_1();
  }
  connect_child_process_cb_cold_2();
  memset(buffer,0x2e,100000);
  large_buf = uv_buf_init(buffer,100000);
  puVar4 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar4,&channel,1);
  if (iVar1 == 0) {
    puVar7 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160722;
    iVar1 = uv_is_writable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160727;
    iVar1 = uv_is_closing((uv_handle_t *)&channel);
    if (iVar1 != 0) goto LAB_0016072c;
    uVar3 = write_until_data_queued();
    if (uVar3 != 0) {
      send_handle_and_close();
    }
    puVar4 = uv_default_loop();
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00160731;
    if (closed_handle_write == '\0') goto LAB_00160736;
    puVar7 = (uv_pipe_t *)uv_default_loop();
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar7 = (uv_pipe_t *)buffer;
LAB_00160722:
    ipc_helper_closed_handle_cold_2();
LAB_00160727:
    ipc_helper_closed_handle_cold_3();
LAB_0016072c:
    ipc_helper_closed_handle_cold_4();
LAB_00160731:
    ipc_helper_closed_handle_cold_5();
LAB_00160736:
    ipc_helper_closed_handle_cold_6();
  }
  ipc_helper_closed_handle_cold_7();
  uVar11 = 0;
  loop_00 = (uv_pipe_t *)write_reqs;
  puStack_80 = (uv_loop_t *)puVar7;
  while( true ) {
    builtin_memcpy(sStack_90.sin_zero,"~\a\x16",4);
    sStack_90.sin_zero[4] = '\0';
    sStack_90.sin_zero[5] = '\0';
    sStack_90.sin_zero[6] = '\0';
    sStack_90.sin_zero[7] = '\0';
    iVar1 = uv_write((uv_write_t *)loop_00,(uv_stream_t *)&channel,&large_buf,1,
                     closed_handle_large_write_cb);
    if (iVar1 != 0) break;
    if (0x12a < uVar11) {
      return;
    }
    uVar11 = uVar11 + 1;
    loop_00 = (uv_pipe_t *)&(((uv_loop_t *)loop_00)->wq_async).type;
    if (channel.write_queue_size != 0) {
      return;
    }
  }
  sStack_90.sin_zero = (uchar  [8])send_handle_and_close;
  write_until_data_queued_cold_1();
  puStack_a0 = (uv_loop_t *)0x1607b9;
  puVar4 = uv_default_loop();
  puStack_a0 = (uv_loop_t *)0x1607c8;
  iVar1 = uv_tcp_init(puVar4,&tcp_server);
  if (iVar1 == 0) {
    puStack_a0 = (uv_loop_t *)0x1607e2;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_90);
    if (iVar1 != 0) goto LAB_00160846;
    puStack_a0 = (uv_loop_t *)0x1607f9;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_90,0);
    if (iVar1 != 0) goto LAB_0016084b;
    puStack_a0 = (uv_loop_t *)0x16082a;
    iVar1 = uv_write2(&write_req,(uv_stream_t *)&channel,&large_buf,1,(uv_stream_t *)&tcp_server,
                      closed_handle_write_cb);
    if (iVar1 == 0) {
      puStack_a0 = (uv_loop_t *)0x16083c;
      uv_close((uv_handle_t *)&tcp_server,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x160846;
    send_handle_and_close_cold_1();
LAB_00160846:
    puStack_a0 = (uv_loop_t *)0x16084b;
    send_handle_and_close_cold_2();
LAB_0016084b:
    puStack_a0 = (uv_loop_t *)0x160850;
    send_handle_and_close_cold_3();
  }
  puStack_a0 = (uv_loop_t *)ipc_helper_bind_twice;
  send_handle_and_close_cold_4();
  puStack_c8 = (uv_loop_t *)0x160870;
  puStack_a0 = (uv_loop_t *)loop_00;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_b0);
  if (iVar1 == 0) {
    puStack_c8 = (uv_loop_t *)0x16087d;
    puVar4 = uv_default_loop();
    puStack_c8 = (uv_loop_t *)0x160891;
    iVar1 = uv_pipe_init(puVar4,&channel,1);
    if (iVar1 != 0) goto LAB_00160a1a;
    loop_00 = &channel;
    puStack_c8 = (uv_loop_t *)0x1608aa;
    uv_pipe_open(&channel,0);
    puStack_c8 = (uv_loop_t *)0x1608b2;
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160a1f;
    puStack_c8 = (uv_loop_t *)0x1608c7;
    iVar1 = uv_is_writable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160a24;
    puStack_c8 = (uv_loop_t *)0x1608dc;
    iVar1 = uv_is_closing((uv_handle_t *)&channel);
    if (iVar1 != 0) goto LAB_00160a29;
    puStack_c8 = (uv_loop_t *)0x1608f5;
    uStack_c0 = uv_buf_init("hello\n",6);
    puStack_c8 = (uv_loop_t *)0x160903;
    puVar4 = uv_default_loop();
    puStack_c8 = (uv_loop_t *)0x160912;
    iVar1 = uv_tcp_init(puVar4,&tcp_server);
    if (iVar1 != 0) goto LAB_00160a2e;
    puStack_c8 = (uv_loop_t *)0x16091f;
    puVar4 = uv_default_loop();
    puStack_c8 = (uv_loop_t *)0x16092e;
    iVar1 = uv_tcp_init(puVar4,&tcp_server2);
    if (iVar1 != 0) goto LAB_00160a33;
    puStack_c8 = (uv_loop_t *)0x160949;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_b0,0);
    if (iVar1 != 0) goto LAB_00160a38;
    puStack_c8 = (uv_loop_t *)0x160964;
    iVar1 = uv_tcp_bind(&tcp_server2,(sockaddr *)&sStack_b0,0);
    if (iVar1 != 0) goto LAB_00160a3d;
    puStack_c8 = (uv_loop_t *)0x160991;
    iVar1 = uv_write2(&write_req,(uv_stream_t *)&channel,&uStack_c0,1,(uv_stream_t *)&tcp_server,
                      (uv_write_cb)0x0);
    if (iVar1 != 0) goto LAB_00160a42;
    puStack_c8 = (uv_loop_t *)0x1609be;
    iVar1 = uv_write2(&write_req2,(uv_stream_t *)&channel,&uStack_c0,1,(uv_stream_t *)&tcp_server2,
                      (uv_write_cb)0x0);
    if (iVar1 != 0) goto LAB_00160a47;
    puStack_c8 = (uv_loop_t *)0x1609cb;
    puVar4 = uv_default_loop();
    puStack_c8 = (uv_loop_t *)0x1609d5;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00160a4c;
    puStack_c8 = (uv_loop_t *)0x1609de;
    loop_00 = (uv_pipe_t *)uv_default_loop();
    puStack_c8 = (uv_loop_t *)0x1609f2;
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    puStack_c8 = (uv_loop_t *)0x1609fc;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    puStack_c8 = (uv_loop_t *)0x160a01;
    puVar4 = uv_default_loop();
    puStack_c8 = (uv_loop_t *)0x160a09;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_c8 = (uv_loop_t *)0x160a1a;
    ipc_helper_bind_twice_cold_1();
LAB_00160a1a:
    puStack_c8 = (uv_loop_t *)0x160a1f;
    ipc_helper_bind_twice_cold_2();
LAB_00160a1f:
    puStack_c8 = (uv_loop_t *)0x160a24;
    ipc_helper_bind_twice_cold_3();
LAB_00160a24:
    puStack_c8 = (uv_loop_t *)0x160a29;
    ipc_helper_bind_twice_cold_4();
LAB_00160a29:
    puStack_c8 = (uv_loop_t *)0x160a2e;
    ipc_helper_bind_twice_cold_5();
LAB_00160a2e:
    puStack_c8 = (uv_loop_t *)0x160a33;
    ipc_helper_bind_twice_cold_6();
LAB_00160a33:
    puStack_c8 = (uv_loop_t *)0x160a38;
    ipc_helper_bind_twice_cold_7();
LAB_00160a38:
    puStack_c8 = (uv_loop_t *)0x160a3d;
    ipc_helper_bind_twice_cold_8();
LAB_00160a3d:
    puStack_c8 = (uv_loop_t *)0x160a42;
    ipc_helper_bind_twice_cold_9();
LAB_00160a42:
    puStack_c8 = (uv_loop_t *)0x160a47;
    ipc_helper_bind_twice_cold_10();
LAB_00160a47:
    puStack_c8 = (uv_loop_t *)0x160a4c;
    ipc_helper_bind_twice_cold_11();
LAB_00160a4c:
    puStack_c8 = (uv_loop_t *)0x160a51;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_c8 = (uv_loop_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  puStack_c8 = (uv_loop_t *)loop_00;
  uStack_d8 = uv_buf_init((char *)0x0,0);
  puVar4 = uv_default_loop();
  puVar7 = &channel;
  iVar1 = uv_pipe_init(puVar4,&channel,0);
  if (iVar1 == 0) {
    puVar7 = (uv_pipe_t *)0x0;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160b59;
    iVar1 = uv_is_writable((uv_stream_t *)&channel);
    if (iVar1 != 1) goto LAB_00160b5e;
    iVar1 = uv_is_closing((uv_handle_t *)&channel);
    if (iVar1 != 0) goto LAB_00160b63;
    puVar7 = &channel;
    iVar1 = uv_write(&write_req,(uv_stream_t *)&channel,&uStack_d8,1,send_zero_write_cb);
    if (iVar1 != 0) goto LAB_00160b68;
    puVar4 = uv_default_loop();
    puVar7 = (uv_pipe_t *)0x0;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00160b6d;
    if (send_zero_write == 1) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      puVar7 = (uv_pipe_t *)0x0;
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00160b77;
    }
  }
  else {
    ipc_helper_send_zero_cold_1();
LAB_00160b59:
    ipc_helper_send_zero_cold_2();
LAB_00160b5e:
    ipc_helper_send_zero_cold_3();
LAB_00160b63:
    ipc_helper_send_zero_cold_4();
LAB_00160b68:
    ipc_helper_send_zero_cold_5();
LAB_00160b6d:
    ipc_helper_send_zero_cold_6();
  }
  ipc_helper_send_zero_cold_7();
LAB_00160b77:
  ipc_helper_send_zero_cold_8();
  if ((int)puVar7 != 0) {
    send_zero_write_cb_cold_1();
    pvVar5 = malloc((size_t)puVar7);
    *extraout_RDX = pvVar5;
    extraout_RDX[1] = puVar7;
    return;
  }
  send_zero_write = send_zero_write + 1;
  return;
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT(status == 0);
    ASSERT((uv_stream_t*)&tcp_server == server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT(r == 0);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT(r == 0);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT(r == 0);

    connection_accepted = 1;
  }
}